

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_split(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argcp)

{
  vm_val_t *pvVar1;
  ushort uVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  vm_obj_id_t vVar7;
  size_t sVar8;
  char *pcVar9;
  uint uVar10;
  vm_val_t *pvVar11;
  vm_obj_id_t vVar12;
  CVmObjPageEntry *this;
  uint16_t tmp;
  uint uVar13;
  ulong idx;
  ushort *str_00;
  size_t len;
  uint local_7c;
  CVmObjPageEntry *local_78;
  char *local_70;
  int match_len;
  int match_ofs;
  ushort *local_60;
  vm_val_t *local_58;
  uint local_4c;
  vm_val_t *local_48;
  vm_val_t ele;
  
  local_60 = (ushort *)str;
  local_48 = self_val;
  if ((getp_split(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar5 = __cxa_guard_acquire(&getp_split(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                   desc), iVar5 != 0)) {
    getp_split::desc.min_argc_ = 0;
    getp_split::desc.opt_argc_ = 2;
    getp_split::desc.varargs_ = 0;
    __cxa_guard_release(&getp_split(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  if (argcp == (uint *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar13 = *argcp;
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argcp,&getp_split::desc);
  pvVar11 = sp_;
  if (iVar5 != 0) {
    return 1;
  }
  uVar2 = *local_60;
  len = (size_t)uVar2;
  local_7c = 0xffffffff;
  if (uVar13 == 0) {
    vVar12 = 1;
    local_78 = (CVmObjPageEntry *)0x0;
    local_70 = (char *)0x0;
  }
  else {
    pvVar1 = sp_ + -1;
    if (pvVar1->typ == VM_NIL) {
      local_70 = (char *)0x0;
      local_78 = (CVmObjPageEntry *)0x0;
      vVar12 = 1;
    }
    else if (pvVar1->typ == VM_INT) {
      vVar12 = sp_[-1].val.obj;
      if ((int)vVar12 < 1) goto LAB_002a4854;
      local_70 = (char *)0x0;
      local_78 = (CVmObjPageEntry *)0x0;
    }
    else {
      local_70 = vm_val_t::get_as_string(pvVar1);
      if (local_70 == (char *)0x0) {
        if ((pvVar1->typ != VM_OBJ) ||
           (iVar5 = CVmObjPattern::is_pattern_obj(pvVar11[-1].val.obj), iVar5 == 0)) {
          err_throw(0x900);
        }
        uVar10 = pvVar11[-1].val.obj;
        local_78 = G_obj_table_X.pages_[uVar10 >> 0xc] + (uVar10 & 0xfff);
        local_70 = (char *)0x0;
      }
      else {
        local_78 = (CVmObjPageEntry *)0x0;
      }
      vVar12 = 0;
    }
    pvVar11 = sp_;
    local_7c = 0xffffffff;
    if (((uVar13 != 1) && (sp_[-2].typ != VM_NIL)) &&
       (local_7c = vm_val_t::num_to_int(sp_ + -2), pvVar11 = sp_, (int)local_7c < 1)) {
LAB_002a4854:
      err_throw(0x902);
    }
  }
  sp_ = pvVar11 + 1;
  uVar4 = *(undefined4 *)&local_48->field_0x4;
  aVar3 = local_48->val;
  pvVar11->typ = local_48->typ;
  *(undefined4 *)&pvVar11->field_0x4 = uVar4;
  pvVar11->val = aVar3;
  uVar10 = local_7c;
  if ((int)local_7c < 1) {
    if (vVar12 == 0) {
      uVar10 = 10;
    }
    else {
      uVar6 = ((uVar2 + vVar12) - 1) / vVar12;
      uVar10 = 1;
      if (1 < (int)uVar6) {
        uVar10 = uVar6;
      }
      if (len == 0) {
        uVar10 = uVar6;
      }
    }
  }
  local_60 = local_60 + 1;
  idx = 0;
  local_58 = retval;
  local_4c = uVar13;
  vVar7 = CVmObjList::create(0,(long)(int)uVar10);
  pvVar1 = local_58;
  local_58->typ = VM_OBJ;
  (local_58->val).obj = vVar7;
  this = G_obj_table_X.pages_[vVar7 >> 0xc] + (vVar7 & 0xfff);
  CVmObjList::cons_clear((CVmObjList *)this);
  pvVar11 = sp_;
  uVar4 = *(undefined4 *)&pvVar1->field_0x4;
  aVar3 = pvVar1->val;
  sp_ = sp_ + 1;
  pvVar11->typ = pvVar1->typ;
  *(undefined4 *)&pvVar11->field_0x4 = uVar4;
  pvVar11->val = aVar3;
  local_58 = (vm_val_t *)(ulong)vVar12;
  str_00 = local_60;
  do {
    if ((int)local_7c < 0) {
      if (len == 0) goto LAB_002a47e5;
    }
    else if (((int)local_7c <= (int)idx + 1) || (len == 0)) {
      if (len == 0) goto LAB_002a47e5;
LAB_002a47ac:
      CVmObjList::cons_ensure_space((CVmObjList *)this,idx & 0xffffffff,0);
      ele.val.obj = create(0,(char *)str_00,len);
      ele.typ = VM_OBJ;
      CVmObjList::cons_set_element((CVmObjList *)this,idx & 0xffffffff,&ele);
      idx = (ulong)((int)idx + 1);
LAB_002a47e5:
      **(undefined2 **)((long)&this->ptr_ + 8) = (short)idx;
      sp_ = sp_ + -(long)(int)(local_4c + 2);
      return 1;
    }
    if (vVar12 == 0) {
      pcVar9 = find_substr(local_48,(char *)local_60,(char *)str_00,len,local_70,
                           (CVmObjPattern *)local_78,&match_ofs,&match_len);
      if (pcVar9 == (char *)0x0) goto LAB_002a47ac;
      iVar5 = (int)pcVar9 - (int)str_00;
    }
    else {
      sVar8 = utf8_ptr::s_bytelen((char *)str_00,(size_t)local_58);
      iVar5 = (int)sVar8;
      match_ofs = iVar5;
      if ((int)len <= iVar5) goto LAB_002a47ac;
      match_len = 0;
    }
    match_ofs = iVar5;
    CVmObjList::cons_ensure_space((CVmObjList *)this,idx,0);
    ele.val.obj = create(0,(char *)str_00,(long)iVar5);
    ele.typ = VM_OBJ;
    CVmObjList::cons_set_element((CVmObjList *)this,idx,&ele);
    str_00 = (ushort *)((long)str_00 + (long)(iVar5 + match_len));
    len = len - (long)(iVar5 + match_len);
    if (((vVar12 == 0) && (match_len == 0)) && (len != 0)) {
      sVar8 = utf8_ptr::s_bytelen((char *)str_00,1);
      str_00 = (ushort *)((long)str_00 + sVar8);
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

int CVmObjString::getp_split(VMG_ vm_val_t *retval,
                             const vm_val_t *self_val,
                             const char *str, uint *argcp)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0, 2);
    uint argc = (argcp != 0 ? *argcp : 0);
    if (get_prop_check_argc(retval, argcp, &desc))
        return TRUE;

    /* get the string buffer and length */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember the start of the base string */
    const char *basestr = str;

    /* 
     *   Get the delimiter or split size, leaving it on the stack for gc
     *   protection.  This can be a string, a RexPattern, or an integer.  
     */
    const vm_val_t *delim = G_stk->get(0);
    const char *delim_str = 0;
    CVmObjPattern *delim_pat = 0;
    int split_len = 0;
    if (argc < 1 || delim->typ == VM_NIL)
    {
        /* there's no delimiter at all, so use the default split length 1 */
        split_len = 1;
    }
    else if (delim->typ == VM_INT)
    {
        /* it's a simple split length */
        split_len = delim->val.intval;
        if (split_len <= 0)
            err_throw(VMERR_BAD_VAL_BIF);
    }
    else if ((delim_str = delim->get_as_string(vmg0_)) == 0)
    {
        /* if it's not a length or string, it has to be a RexPattern object */
        if (delim->typ != VM_OBJ
            || !CVmObjPattern::is_pattern_obj(vmg_ delim->val.obj))
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the pattern object, properly cast */
        delim_pat = (CVmObjPattern *)vm_objp(vmg_ delim->val.obj);
    }

    /* get the split count limit, if there is one */
    int32_t limit = -1;
    if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
    {
        /* there's an explicit limit; fetch it and make sure it's at least 1 */
        if ((limit = G_stk->get(1)->num_to_int(vmg0_)) < 1)
            err_throw(VMERR_BAD_VAL_BIF);
    }

    /* push 'self' for gc protection */
    G_stk->push(self_val);

    /* 
     *   Set up a return list.  If we have a limit, the list can't go over
     *   that length, so just create the list at the limit.  Otherwise, if we
     *   have a split length, we can figure the required list length by
     *   dividing the string length by the split length (rounding up).
     *   Otherwise we have no idea how many list elements we'll need, so just
     *   create the list at an arbitrary default length and expand later if
     *   needed.  
     */
    int init_list_len;
    if (limit > 0)
    {
        /* there's a limit, so we won't need more than this many elements */
        init_list_len = limit;
    }
    else if (split_len > 0)
    {
        /* split length -> divide the string length by the split length */
        init_list_len = (len + split_len - 1)/split_len;

        /* set the length to at least one, unless it's an empty string */
        if (init_list_len < 1 && len != 0)
            init_list_len = 1;
    }
    else
    {
        /* no limit or length, so start with an arbitrary guess */
        init_list_len = 10;
    }

    /* create the list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, init_list_len));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* clear the list to nils, since we're building it incrementally */
    lst->cons_clear();

    /* push it for gc protection */
    G_stk->push(retval);

    /* repeatedly search for the delimiter and split the string */
    int cnt;
    vm_val_t ele;
    for (cnt = 0 ; (limit < 0 || cnt + 1 < limit) && len != 0 ; ++cnt)
    {
        /* search for the next delimiter or next 'split_len' characters */
        int match_ofs, match_len;
        if (split_len > 0)
        {
            /* figure the number of bytes in split_len characters */
            match_ofs = utf8_ptr::s_bytelen(str, split_len);

            /* if that uses the whole rest of the string, we're done */
            if (match_ofs >= (int)len)
                break;

            /* there's no delimiter, so the delimiter match length is zero */
            match_len = 0;
        }
        else
        {
            /* search for the substring or pattern */
            const char *nxt = find_substr(
                vmg_ self_val, basestr, str, len, delim_str, delim_pat,
                &match_ofs, &match_len);

            /* if we didn't find it, we're done */
            if (nxt == 0)
                break;

            /* figure the byte offset to the match */
            match_ofs = nxt - str;
        }

        /* add the substring from 'str' to 'p' to the list */
        lst->cons_ensure_space(vmg_ cnt, 0);
        ele.set_obj(CVmObjString::create(vmg_ FALSE, str, match_ofs));
        lst->cons_set_element(cnt, &ele);

        /* skip to the position after the match */
        size_t skip = match_ofs + match_len;
        str += skip;
        len -= skip;

        /* 
         *   if we matched zero characters, skip one character to prevent an
         *   infinite loop 
         */
        if (split_len == 0 && match_len == 0 && len != 0)
            str += utf8_ptr::s_bytelen(str, 1);
    }

    /* add a final element for the remainder of the string */
    if (len != 0)
    {
        lst->cons_ensure_space(vmg_ cnt, 0);
        ele.set_obj(CVmObjString::create(vmg_ FALSE, str, len));
        lst->cons_set_element(cnt, &ele);

        /* count it */
        ++cnt;
    }

    /* set the final size of the list */
    lst->cons_set_len(cnt);

    /* discard arguments plus gc protection */
    G_stk->discard(argc + 2);

    /* handled */
    return TRUE;
}